

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O1

void __thiscall InputInterfaceToStream::~InputInterfaceToStream(InputInterfaceToStream *this)

{
  _func_int **pp_Var1;
  size_type *psVar2;
  
  this[-1].mPos = (size_type)&PTR__InputInterfaceToStream_003a9a48;
  (this->super_IByteReader)._vptr_IByteReader = (_func_int **)&PTR__InputInterfaceToStream_003a9a80;
  pp_Var1 = (this->super_IReadPositionProvider)._vptr_IReadPositionProvider;
  psVar2 = &(this->mInput)._M_string_length;
  if (pp_Var1 != (_func_int **)psVar2) {
    operator_delete(pp_Var1,*psVar2 + 1);
    return;
  }
  return;
}

Assistant:

virtual ~InputInterfaceToStream(){}